

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  xmlBufferAllocationScheme xVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  size_t sVar6;
  char *extra;
  ulong uVar7;
  
  if (buf == (xmlBufferPtr)0x0) {
    return 0;
  }
  xVar1 = buf->alloc;
  if (xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) {
    return 0;
  }
  uVar2 = buf->size;
  if (size < uVar2) {
    return 1;
  }
  if (0xfffffff5 < size) {
    extra = "growing buffer past UINT_MAX";
    goto LAB_0018373e;
  }
  switch(xVar1) {
  case XML_BUFFER_ALLOC_DOUBLEIT:
  case XML_BUFFER_ALLOC_IO:
    sVar6 = (size_t)(size + 10);
    if (uVar2 != 0) {
      sVar6 = (size_t)uVar2;
    }
    while (uVar5 = (uint)sVar6, uVar5 < size) {
      if ((int)uVar5 < 0) goto LAB_00183737;
      sVar6 = (size_t)(uVar5 * 2);
    }
    break;
  case XML_BUFFER_ALLOC_EXACT:
    size = size + 10;
LAB_00183658:
    sVar6 = (size_t)size;
    goto LAB_0018369d;
  default:
    sVar6 = (size_t)(size + 10);
    break;
  case XML_BUFFER_ALLOC_HYBRID:
    uVar5 = uVar2;
    if (buf->use < 0x1000) goto LAB_00183658;
    for (; sVar6 = (size_t)uVar5, uVar5 < size; uVar5 = uVar5 * 2) {
      if ((int)uVar5 < 0) goto LAB_00183737;
    }
  }
  uVar5 = (uint)sVar6;
  if ((xVar1 == XML_BUFFER_ALLOC_IO) && (pxVar4 = buf->contentIO, pxVar4 != (xmlChar *)0x0)) {
    uVar7 = (long)buf->content - (long)pxVar4;
    if (sVar6 < uVar7) {
      memmove(pxVar4,buf->content,(ulong)buf->use);
      buf->content = buf->contentIO;
      buf->contentIO[buf->use] = '\0';
      goto LAB_00183714;
    }
    pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar6 + uVar7);
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00183737;
    buf->contentIO = pxVar4;
    pxVar4 = pxVar4 + uVar7;
  }
  else {
LAB_0018369d:
    uVar5 = (uint)sVar6;
    if (buf->content != (xmlChar *)0x0) {
      if (uVar2 - buf->use < 100) {
        pxVar4 = (xmlChar *)(*xmlRealloc)(buf->content,sVar6);
        if (pxVar4 != (xmlChar *)0x0) goto LAB_00183711;
      }
      else {
        pxVar4 = (xmlChar *)(*xmlMallocAtomic)(sVar6);
        if (pxVar4 != (xmlChar *)0x0) {
          memcpy(pxVar4,buf->content,(ulong)buf->use);
          (*xmlFree)(buf->content);
          pxVar3 = pxVar4 + buf->use;
          goto LAB_0018370e;
        }
      }
LAB_00183737:
      extra = "growing buffer";
LAB_0018373e:
      xmlTreeErrMemory(extra);
      return 0;
    }
    pxVar3 = (xmlChar *)(*xmlMallocAtomic)(sVar6);
    buf->use = 0;
    pxVar4 = pxVar3;
LAB_0018370e:
    *pxVar3 = '\0';
  }
LAB_00183711:
  buf->content = pxVar4;
LAB_00183714:
  buf->size = uVar5;
  return 1;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    unsigned int newSize;
    xmlChar* rebuf = NULL;
    size_t start_buf;

    if (buf == NULL)
        return(0);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);

    /* Don't resize if we don't have to */
    if (size < buf->size)
        return 1;

    if (size > UINT_MAX - 10) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return 0;
    }

    /* figure out new size */
    switch (buf->alloc){
	case XML_BUFFER_ALLOC_IO:
	case XML_BUFFER_ALLOC_DOUBLEIT:
	    /*take care of empty case*/
            if (buf->size == 0)
                newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
            else
                newSize = buf->size;
	    while (size > newSize) {
	        if (newSize > UINT_MAX / 2) {
	            xmlTreeErrMemory("growing buffer");
	            return 0;
	        }
	        newSize *= 2;
	    }
	    break;
	case XML_BUFFER_ALLOC_EXACT:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
        case XML_BUFFER_ALLOC_HYBRID:
            if (buf->use < BASE_BUFFER_SIZE)
                newSize = size;
            else {
                newSize = buf->size;
                while (size > newSize) {
                    if (newSize > UINT_MAX / 2) {
                        xmlTreeErrMemory("growing buffer");
                        return 0;
                    }
                    newSize *= 2;
                }
            }
            break;

	default:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        start_buf = buf->content - buf->contentIO;

        if (start_buf > newSize) {
	    /* move data back to start */
	    memmove(buf->contentIO, buf->content, buf->use);
	    buf->content = buf->contentIO;
	    buf->content[buf->use] = 0;
	    buf->size += start_buf;
	} else {
	    rebuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + newSize);
	    if (rebuf == NULL) {
		xmlTreeErrMemory("growing buffer");
		return 0;
	    }
	    buf->contentIO = rebuf;
	    buf->content = rebuf + start_buf;
	}
    } else {
	if (buf->content == NULL) {
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    buf->use = 0;
	    rebuf[buf->use] = 0;
	} else if (buf->size - buf->use < 100) {
	    rebuf = (xmlChar *) xmlRealloc(buf->content, newSize);
        } else {
	    /*
	     * if we are reallocating a buffer far from being full, it's
	     * better to make a new allocation and copy only the used range
	     * and free the old one.
	     */
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    if (rebuf != NULL) {
		memcpy(rebuf, buf->content, buf->use);
		xmlFree(buf->content);
		rebuf[buf->use] = 0;
	    }
	}
	if (rebuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return 0;
	}
	buf->content = rebuf;
    }
    buf->size = newSize;

    return 1;
}